

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_refresh(HTS_Engine *engine)

{
  HTS_GStreamSet_clear(&engine->gss);
  HTS_PStreamSet_clear(&engine->pss);
  HTS_SStreamSet_clear(&engine->sss);
  HTS_Label_clear(&engine->label);
  (engine->condition).stop = '\0';
  return;
}

Assistant:

void HTS_Engine_refresh(HTS_Engine * engine)
{
   /* free generated parameter stream set */
   HTS_GStreamSet_clear(&engine->gss);
   /* free parameter stream set */
   HTS_PStreamSet_clear(&engine->pss);
   /* free state stream set */
   HTS_SStreamSet_clear(&engine->sss);
   /* free label list */
   HTS_Label_clear(&engine->label);
   /* stop flag */
   engine->condition.stop = FALSE;
}